

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool MeCab::toLower(string *s)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RDI;
  char c;
  size_t i;
  undefined8 local_10;
  
  local_10 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= local_10) break;
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar1 = *pcVar3;
    if (('@' < cVar1) && (cVar1 < '[')) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
      *pcVar3 = cVar1 + ' ';
    }
    local_10 = local_10 + 1;
  }
  return true;
}

Assistant:

bool toLower(std::string *s) {
  for (size_t i = 0; i < s->size(); ++i) {
    char c = (*s)[i];
    if ((c >= 'A') && (c <= 'Z')) {
      c += 'a' - 'A';
      (*s)[i] = c;
    }
  }
  return true;
}